

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O3

void __thiscall
Assimp::ValidateDSProcess::SearchForInvalidTextures
          (ValidateDSProcess *this,aiMaterial *pMaterial,aiTextureType type)

{
  char *pcVar1;
  uint uVar2;
  aiMaterialProperty **ppaVar3;
  aiMaterialProperty *paVar4;
  aiMesh *paVar5;
  ValidateDSProcess *pVVar6;
  bool bVar7;
  int iVar8;
  aiScene *paVar9;
  uint uVar10;
  aiMaterial *paVar11;
  ulong uVar12;
  ValidateDSProcess *pVVar13;
  long lVar14;
  ulong uVar15;
  vector<aiTextureMapping,_std::allocator<aiTextureMapping>_> mappings;
  uint local_78;
  allocator_type local_6d;
  aiTextureType local_6c;
  char *local_68;
  char *local_60;
  aiMaterial *local_58;
  ValidateDSProcess *local_50;
  _func_int **local_48;
  
  local_6c = type;
  local_60 = TextureTypeToString(type);
  uVar2 = pMaterial->mNumProperties;
  if ((ulong)uVar2 == 0) {
    return;
  }
  ppaVar3 = pMaterial->mProperties;
  uVar10 = 0xffffffff;
  uVar15 = 0;
  local_78 = 0;
  local_58 = pMaterial;
  local_50 = this;
  do {
    paVar4 = ppaVar3[uVar15];
    if (paVar4 == (aiMaterialProperty *)0x0) {
      __assert_fail("nullptr != prop",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/ValidateDataStructure.cpp"
                    ,0x243,
                    "void Assimp::ValidateDSProcess::SearchForInvalidTextures(const aiMaterial *, aiTextureType)"
                   );
    }
    pcVar1 = (paVar4->mKey).data;
    pVVar13 = (ValidateDSProcess *)pcVar1;
    iVar8 = strcmp(pcVar1,"$tex.file");
    pVVar6 = local_50;
    paVar11 = local_58;
    if ((iVar8 == 0) && (paVar4->mSemantic == local_6c)) {
      if ((int)uVar10 <= (int)paVar4->mIndex) {
        uVar10 = paVar4->mIndex;
      }
      if (paVar4->mType != aiPTI_String) {
        ReportError(pVVar13,"Material property %s is expected to be a string",pcVar1);
      }
      local_78 = local_78 + 1;
    }
    uVar15 = uVar15 + 1;
  } while (uVar2 != uVar15);
  if (uVar10 + 1 != local_78) {
    ReportError(pVVar13,"%s #%i is set, but there are only %i %s textures",local_60,(ulong)uVar10,
                (ulong)local_78,local_60);
  }
  if (local_78 == 0) {
    return;
  }
  pVVar13 = (ValidateDSProcess *)&local_48;
  std::vector<aiTextureMapping,_std::allocator<aiTextureMapping>_>::vector
            ((vector<aiTextureMapping,_std::allocator<aiTextureMapping>_> *)pVVar13,
             (long)(int)local_78,&local_6d);
  if (paVar11->mNumProperties != 0) {
    bVar7 = true;
    local_68 = "Material property %s%i is expected to be an integer (size is %i)";
    uVar15 = 0;
    do {
      paVar4 = paVar11->mProperties[uVar15];
      if (paVar4->mSemantic == local_6c) {
        uVar2 = paVar4->mIndex;
        if ((int)local_78 <= (int)uVar2) {
          ReportError(pVVar13,
                      "Found texture property with index %i, although there are only %i textures of type %s"
                      ,(ulong)uVar2,(ulong)local_78,local_60);
        }
        pcVar1 = (paVar4->mKey).data;
        pVVar13 = (ValidateDSProcess *)pcVar1;
        iVar8 = strcmp(pcVar1,"$tex.mapping");
        if (iVar8 == 0) {
          if (paVar4->mType != aiPTI_Integer) goto LAB_0013e110;
          uVar12 = (ulong)paVar4->mDataLength;
          if (paVar4->mDataLength < 4) goto LAB_0013e125;
LAB_0013e023:
          *(int *)((long)local_48 + (ulong)uVar2 * 4) = *(int *)paVar4->mData;
        }
        else {
          pVVar13 = (ValidateDSProcess *)pcVar1;
          iVar8 = strcmp(pcVar1,"$tex.uvtrafo");
          if (iVar8 == 0) {
            if (paVar4->mType == aiPTI_Float) {
              uVar12 = (ulong)paVar4->mDataLength;
              if (paVar4->mDataLength < 0x14) {
                local_68 = "Material property %s%i is expected to be 5 floats large (size is %i)";
                goto LAB_0013e125;
              }
              goto LAB_0013e023;
            }
            local_68 = "Material property %s%i is expected to be 5 floats large (size is %i)";
LAB_0013e110:
            uVar12 = (ulong)paVar4->mDataLength;
LAB_0013e125:
            ReportError(pVVar13,local_68,pcVar1,(ulong)uVar2,uVar12);
          }
          pVVar13 = (ValidateDSProcess *)pcVar1;
          iVar8 = strcmp(pcVar1,"$tex.uvwsrc");
          if (iVar8 == 0) {
            if (paVar4->mType != aiPTI_Integer) goto LAB_0013e110;
            uVar12 = (ulong)paVar4->mDataLength;
            if (paVar4->mDataLength < 4) goto LAB_0013e125;
            uVar10 = *(uint *)paVar4->mData;
            paVar9 = pVVar6->mScene;
            if (paVar9->mNumMeshes != 0) {
              uVar12 = 0;
              do {
                paVar5 = paVar9->mMeshes[uVar12];
                if (uVar15 == paVar5->mMaterialIndex) {
                  lVar14 = 0;
                  do {
                    if ((paVar5->mTextureCoords[lVar14] == (aiVector3D *)0x0) ||
                       (paVar5->mNumVertices == 0)) goto LAB_0013dfb5;
                    lVar14 = lVar14 + 1;
                  } while (lVar14 != 8);
                  lVar14 = 8;
LAB_0013dfb5:
                  if ((int)lVar14 <= (int)uVar10) {
                    ReportWarning(pVVar13,
                                  "Invalid UV index: %i (key %s). Mesh %i has only %i UV channels",
                                  (ulong)uVar10,pcVar1,uVar12 & 0xffffffff);
                    paVar9 = pVVar6->mScene;
                  }
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 < paVar9->mNumMeshes);
            }
            bVar7 = false;
          }
        }
      }
      uVar15 = uVar15 + 1;
      paVar11 = local_58;
    } while (uVar15 < local_58->mNumProperties);
    if (!bVar7) goto LAB_0013e09e;
  }
  paVar9 = pVVar6->mScene;
  if (paVar9->mNumMeshes != 0) {
    uVar15 = 0;
    do {
      if (((paVar9->mMeshes[uVar15]->mMaterialIndex == uVar10) && (*(int *)local_48 == 0)) &&
         (paVar9->mMeshes[uVar15]->mTextureCoords[0] == (aiVector3D *)0x0)) {
        ReportWarning(pVVar13,"UV-mapped texture, but there are no UV coords");
        paVar9 = pVVar6->mScene;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < paVar9->mNumMeshes);
  }
LAB_0013e09e:
  if (local_48 != (_func_int **)0x0) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

void ValidateDSProcess::SearchForInvalidTextures(const aiMaterial* pMaterial,
    aiTextureType type)
{
    const char* szType = TextureTypeToString(type);

    // ****************************************************************************
    // Search all keys of the material ...
    // textures must be specified with ascending indices
    // (e.g. diffuse #2 may not be specified if diffuse #1 is not there ...)
    // ****************************************************************************

    int iNumIndices = 0;
    int iIndex = -1;
    for (unsigned int i = 0; i < pMaterial->mNumProperties;++i) {
        aiMaterialProperty* prop = pMaterial->mProperties[ i ];
        ai_assert(nullptr != prop);
        if ( !::strcmp(prop->mKey.data,"$tex.file") && prop->mSemantic == static_cast<unsigned int>(type))  {
            iIndex = std::max(iIndex, (int) prop->mIndex);
            ++iNumIndices;

            if (aiPTI_String != prop->mType) {
                ReportError("Material property %s is expected to be a string", prop->mKey.data);
            }
        }
    }
    if (iIndex +1 != iNumIndices)   {
        ReportError("%s #%i is set, but there are only %i %s textures",
            szType,iIndex,iNumIndices,szType);
    }
    if (!iNumIndices)return;
    std::vector<aiTextureMapping> mappings(iNumIndices);

    // Now check whether all UV indices are valid ...
    bool bNoSpecified = true;
    for (unsigned int i = 0; i < pMaterial->mNumProperties;++i)
    {
        aiMaterialProperty* prop = pMaterial->mProperties[i];
        if (prop->mSemantic != type)continue;

        if ((int)prop->mIndex >= iNumIndices)
        {
            ReportError("Found texture property with index %i, although there "
                "are only %i textures of type %s",
                prop->mIndex, iNumIndices, szType);
        }

        if (!::strcmp(prop->mKey.data,"$tex.mapping"))  {
            if (aiPTI_Integer != prop->mType || prop->mDataLength < sizeof(aiTextureMapping))
            {
                ReportError("Material property %s%i is expected to be an integer (size is %i)",
                    prop->mKey.data,prop->mIndex,prop->mDataLength);
            }
            mappings[prop->mIndex] = *((aiTextureMapping*)prop->mData);
        }
        else if (!::strcmp(prop->mKey.data,"$tex.uvtrafo")) {
            if (aiPTI_Float != prop->mType || prop->mDataLength < sizeof(aiUVTransform))
            {
                ReportError("Material property %s%i is expected to be 5 floats large (size is %i)",
                    prop->mKey.data,prop->mIndex, prop->mDataLength);
            }
            mappings[prop->mIndex] = *((aiTextureMapping*)prop->mData);
        }
        else if (!::strcmp(prop->mKey.data,"$tex.uvwsrc")) {
            if (aiPTI_Integer != prop->mType || sizeof(int) > prop->mDataLength)
            {
                ReportError("Material property %s%i is expected to be an integer (size is %i)",
                    prop->mKey.data,prop->mIndex,prop->mDataLength);
            }
            bNoSpecified = false;

            // Ignore UV indices for texture channels that are not there ...

            // Get the value
            iIndex = *((unsigned int*)prop->mData);

            // Check whether there is a mesh using this material
            // which has not enough UV channels ...
            for (unsigned int a = 0; a < mScene->mNumMeshes;++a)
            {
                aiMesh* mesh = this->mScene->mMeshes[a];
                if(mesh->mMaterialIndex == (unsigned int)i)
                {
                    int iChannels = 0;
                    while (mesh->HasTextureCoords(iChannels))++iChannels;
                    if (iIndex >= iChannels)
                    {
                        ReportWarning("Invalid UV index: %i (key %s). Mesh %i has only %i UV channels",
                            iIndex,prop->mKey.data,a,iChannels);
                    }
                }
            }
        }
    }
    if (bNoSpecified)
    {
        // Assume that all textures are using the first UV channel
        for (unsigned int a = 0; a < mScene->mNumMeshes;++a)
        {
            aiMesh* mesh = mScene->mMeshes[a];
            if(mesh->mMaterialIndex == (unsigned int)iIndex && mappings[0] == aiTextureMapping_UV)
            {
                if (!mesh->mTextureCoords[0])
                {
                    // This is a special case ... it could be that the
                    // original mesh format intended the use of a special
                    // mapping here.
                    ReportWarning("UV-mapped texture, but there are no UV coords");
                }
            }
        }
    }
}